

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O1

path * __thiscall filesystem::path::operator/=(path *this,path *p)

{
  char *pcVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((p->path_)._M_string_length != 0) {
    if (this == p) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"\'path\' self append not defined");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pcVar1 = (p->path_)._M_dataplus._M_p;
    if (*pcVar1 == '/') {
      std::__cxx11::string::_M_append((char *)this,(ulong)pcVar1);
    }
    else {
      std::operator+(&local_30,'/',&p->path_);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_30._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return this;
}

Assistant:

path& operator/=(const path& p)
    {
        if (p.empty()) {
            return *this;
        }

        if (this == &p)  // self-append
        {
            throw std::invalid_argument("'path' self append not defined");
            /*path rhs(p);
            if (!detail::is_directory_separator(rhs.path_[0]))
                m_append_separator_if_needed();
            m_pathname += rhs.m_pathname;*/
        }
        else {
            /*if (!detail::is_directory_separator(*p.m_pathname.begin()))
                m_append_separator_if_needed();
            m_pathname += p.m_pathname;*/
            if (p.path_[0] != separator_) {
                this->path_ += (separator_ + p.path_);
            }
            else {
                this->path_ += p.path_;
            }
        }
        return *this;
    }